

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptDefaultLabel(HlslGrammar *this,TIntermNode **statement)

{
  HlslParseContext *pHVar1;
  bool bVar2;
  TIntermBranch *pTVar3;
  TSourceLoc loc;
  TSourceLoc local_38;
  
  local_38.column = (this->super_HlslTokenStream).token.loc.column;
  local_38._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  local_38.name = (this->super_HlslTokenStream).token.loc.name;
  local_38.string = (this->super_HlslTokenStream).token.loc.string;
  local_38.line = (this->super_HlslTokenStream).token.loc.line;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokDefault);
  if (bVar2) {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
    pHVar1 = this->parseContext;
    if (bVar2) {
      pTVar3 = TIntermediate::addBranch
                         ((pHVar1->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpDefault,&local_38);
      *statement = &pTVar3->super_TIntermNode;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      (*(pHVar1->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (pHVar1,&(this->super_HlslTokenStream).token,"Expected",":","");
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HlslGrammar::acceptDefaultLabel(TIntermNode*& statement)
{
    TSourceLoc loc = token.loc;
    if (! acceptTokenClass(EHTokDefault))
        return false;

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    statement = parseContext.intermediate.addBranch(EOpDefault, loc);

    return true;
}